

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int get_traffic_keys(ptls_aead_algorithm_t *aead,ptls_hash_algorithm_t *hash,void *key,void *iv,
                    void *secret,ptls_iovec_t hash_value,char *label_prefix)

{
  int iVar1;
  ptls_iovec_t secret_00;
  ptls_iovec_t secret_01;
  
  secret_00.len = hash->digest_size;
  secret_00.base = (uint8_t *)secret;
  iVar1 = ptls_hkdf_expand_label(hash,key,aead->key_size,secret_00,"key",hash_value,label_prefix);
  if ((iVar1 == 0) &&
     (secret_01.len = hash->digest_size, secret_01.base = (uint8_t *)secret,
     iVar1 = ptls_hkdf_expand_label(hash,iv,aead->iv_size,secret_01,"iv",hash_value,label_prefix),
     iVar1 == 0)) {
    iVar1 = 0;
  }
  else {
    (*ptls_clear_memory)(key,aead->key_size);
    (*ptls_clear_memory)(iv,aead->iv_size);
  }
  return iVar1;
}

Assistant:

static int get_traffic_keys(ptls_aead_algorithm_t *aead, ptls_hash_algorithm_t *hash, void *key, void *iv, const void *secret,
                            ptls_iovec_t hash_value, const char *label_prefix)
{
    int ret;

    if ((ret = get_traffic_key(hash, key, aead->key_size, 0, secret, hash_value, label_prefix)) != 0 ||
        (ret = get_traffic_key(hash, iv, aead->iv_size, 1, secret, hash_value, label_prefix)) != 0) {
        ptls_clear_memory(key, aead->key_size);
        ptls_clear_memory(iv, aead->iv_size);
    }

    return ret;
}